

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::EnumFieldGenerator::GenerateExtensionCode
          (EnumFieldGenerator *this,Printer *printer)

{
  Options *options;
  string_view text;
  string_view text_00;
  
  options = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment
            (printer,options,
             (this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag((FieldGeneratorBase *)this,printer);
  text._M_str = 
  "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n  new pb::Extension<$extended_type$, $type_name$>($number$, "
  ;
  text._M_len = 0x99;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.variables_,text
            );
  (*(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.super_SourceGeneratorBase.
    _vptr_SourceGeneratorBase[4])(this,printer);
  text_00._M_str = ");\n";
  text_00._M_len = 3;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void EnumFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::Extension<$extended_type$, $type_name$>($number$, ");
  GenerateCodecCode(printer);
  printer->Print(");\n");
}